

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O2

bool __thiscall TypeInfo::testUnions(TypeInfo *this)

{
  bool bVar1;
  DOMElement *pDVar2;
  long *plVar3;
  long *plVar4;
  XMLCh *pXVar5;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  wchar16 *pwVar9;
  long *plVar10;
  undefined1 uVar11;
  XStr local_38;
  XStr local_30;
  
  (**(code **)(*(long *)this->doc + 0x68))();
  XStr::XStr(&local_38,"unionTest");
  pDVar2 = findElement(this,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  plVar3 = (long *)(**(code **)(*(long *)pDVar2 + 0x38))(pDVar2);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"decimalDerivedType");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  uVar11 = tmp;
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f1);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"decimalDerivedType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"stringDerivedType");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,500);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"stringDerivedType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"decimal");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1f7);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"decimal");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"string");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fa);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"string");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x1d8))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  XStr::XStr(&local_38,"testAttr");
  plVar4 = (long *)(**(code **)(*plVar3 + 0x198))(plVar3,0,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  XStr::XStr(&local_38,"decimalDerivedType");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1fe);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"decimalDerivedType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_38,"testAttr2");
  plVar4 = (long *)(**(code **)(*plVar3 + 0x198))(plVar3,0,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  XStr::XStr(&local_38,"stringDerivedType");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x200);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"stringDerivedType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  XStr::XStr(&local_38,"testAttr");
  plVar4 = (long *)(**(code **)(*plVar3 + 0x198))(plVar3,0,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  XStr::XStr(&local_38,"stringDerivedType");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x204);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"stringDerivedType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_38,"testAttr2");
  plVar4 = (long *)(**(code **)(*plVar3 + 0x198))(plVar3,0,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  XStr::XStr(&local_38,"decimalDerivedType");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    XStr::XStr(&local_30,"");
    tmp = xercesc_4_0::XMLString::equals(pXVar5,local_30.fUnicodeForm);
    XStr::~XStr(&local_30);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x206);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"decimalDerivedType");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    XStr::XStr(&local_30,"");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_30.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_30);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  XStr::XStr(&local_38,"testAttr");
  plVar4 = (long *)(**(code **)(*plVar3 + 0x198))(plVar3,0,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  XStr::XStr(&local_38,"decimal");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20a);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"decimal");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_38,"testAttr2");
  plVar4 = (long *)(**(code **)(*plVar3 + 0x198))(plVar3,0,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  XStr::XStr(&local_38,"string");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x20c);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"string");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x50))(plVar3);
  XStr::XStr(&local_38,"testAttr");
  plVar4 = (long *)(**(code **)(*plVar3 + 0x198))(plVar3,0,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
  pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x10))(plVar10);
  XStr::XStr(&local_38,"string");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    pXVar5 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x210);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"string");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x10))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar10 + 0x10))(plVar10);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar10 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
    lVar8 = (**(code **)(*plVar10 + 0x18))(plVar10);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar4 + 0x170))(plVar4);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x18))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  XStr::XStr(&local_38,"testAttr2");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x198))(plVar3,0,local_38.fUnicodeForm);
  XStr::~XStr(&local_38);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  XStr::XStr(&local_38,"decimal");
  bVar1 = xercesc_4_0::XMLString::equals(pXVar5,local_38.fUnicodeForm);
  if (bVar1) {
    plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
    pXVar5 = (XMLCh *)(**(code **)(*plVar4 + 0x18))(plVar4);
    tmp = xercesc_4_0::XMLString::equals
                    (pXVar5,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
  }
  else {
    tmp = false;
  }
  XStr::~XStr(&local_38);
  if (tmp == false) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"DOMTypeInfo test failed at line, ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x212);
    poVar6 = std::operator<<(poVar6,"\nExpected values : typename \'");
    XStr::XStr(&local_38,"decimal");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               (local_38.fUnicodeForm,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                               );
    poVar6 = std::operator<<(poVar6,pcVar7);
    poVar6 = std::operator<<(poVar6,"\', uri \'");
    pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                               ((wchar16 *)&xercesc_4_0::SchemaSymbols::fgURI_SCHEMAFORSCHEMA,
                                xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    std::operator<<(poVar6,pcVar7);
    XStr::~XStr(&local_38);
    std::operator<<((ostream *)&std::cerr,"\'\nActual values   : typename \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    std::operator<<((ostream *)&std::cerr,"\', uri \'");
    plVar4 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
    lVar8 = (**(code **)(*plVar4 + 0x18))(plVar4);
    if (lVar8 == 0) {
      pcVar7 = "(null)";
    }
    else {
      plVar3 = (long *)(**(code **)(*plVar3 + 0x170))(plVar3);
      pwVar9 = (wchar16 *)(**(code **)(*plVar3 + 0x18))(plVar3);
      pcVar7 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    std::operator<<((ostream *)&std::cerr,pcVar7);
    poVar6 = std::operator<<((ostream *)&std::cerr,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar6);
    uVar11 = 0;
  }
  return (bool)uVar11;
}

Assistant:

bool TypeInfo::testUnions() {

    bool passed = true;
    DOMNode *docEle = doc->getDocumentElement();
    UNUSED(docEle); // silence warning
    DOMAttr *testAttr;

    //element unionTest
    DOMElement *testEle = findElement(X("unionTest"));

    testEle = (DOMElement *)testEle->getFirstChild()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    DOMTYPEINFOTEST(testEle->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("stringDerivedType"), X(""), __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimalDerivedType"), X(""), __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    testEle = (DOMElement *)testEle->getNextSibling()->getNextSibling();
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("string"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);
    testAttr = testEle->getAttributeNodeNS(0, X("testAttr2"));
    DOMTYPEINFOTEST(testAttr->getSchemaTypeInfo(), X("decimal"), SchemaSymbols::fgURI_SCHEMAFORSCHEMA, __LINE__);

    return passed;

}